

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O3

void irem_ga20_w(void *info,UINT8 offset,UINT8 data)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  
  uVar3 = offset & 0x1f;
  *(UINT8 *)((long)info + (ulong)uVar3 + 0x14) = data;
  uVar3 = uVar3 >> 3;
  puVar5 = (uint *)((long)info + (ulong)uVar3 * 0x1c + 0x34);
  switch(offset & 7) {
  case 0:
    uVar3 = *puVar5 & 0xff000;
    uVar4 = (uint)data << 4;
    break;
  case 1:
    uVar3 = *puVar5 & 0xff0;
    uVar4 = (uint)data << 0xc;
    break;
  case 2:
    uVar4 = *(uint *)((long)info + (ulong)uVar3 * 0x1c + 0x38) & 0xff000;
    uVar6 = (uint)data << 4;
    goto LAB_0017218e;
  case 3:
    uVar4 = *(uint *)((long)info + (ulong)uVar3 * 0x1c + 0x38) & 0xff0;
    uVar6 = (uint)data << 0xc;
LAB_0017218e:
    *(uint *)((long)info + (ulong)uVar3 * 0x1c + 0x38) = uVar6 | uVar4;
    return;
  case 4:
    *(UINT8 *)((long)info + (ulong)uVar3 * 0x1c + 0x4a) = data;
    *(int *)((long)info + (ulong)uVar3 * 0x1c + 0x44) = (int)(0x10000 / (ulong)(0x100 - data));
    return;
  case 5:
    *(short *)((long)info + (ulong)uVar3 * 0x1c + 0x48) = (short)(((uint)data << 8) / (data + 10));
    return;
  case 6:
    if ((data & 2) == 0) {
      *(undefined1 *)((long)info + (ulong)uVar3 * 0x1c + 0x4c) = 0;
    }
    else {
      *(undefined1 *)((long)info + (ulong)uVar3 * 0x1c + 0x4c) = 1;
      uVar4 = *puVar5;
      *(uint *)((long)info + (ulong)uVar3 * 0x1c + 0x3c) = uVar4;
      *(undefined1 *)((long)info + (ulong)uVar3 * 0x1c + 0x4b) =
           *(undefined1 *)((long)info + (ulong)uVar3 * 0x1c + 0x4a);
      *(undefined4 *)((long)info + (ulong)uVar3 * 0x1c + 0x40) = 0;
      lVar2 = *(long *)((long)info + 8);
      cVar1 = *(char *)(lVar2 + (ulong)uVar4);
      if (cVar1 == '\0') {
        *(undefined1 *)((long)info + (ulong)uVar3 * 0x1c + 0x4c) = 0;
      }
      else {
        *(char *)((long)info + (ulong)uVar3 * 0x1c + 0x4e) = cVar1 + -0x80;
      }
      cVar1 = *(char *)(lVar2 + (ulong)(uVar4 + 1));
      if (cVar1 != '\0') {
        *(char *)((long)info + (ulong)uVar3 * 0x1c + 0x4f) = cVar1 + -0x80;
        return;
      }
    }
  case 7:
    return;
  }
  *puVar5 = uVar4 | uVar3;
  return;
}

Assistant:

static void irem_ga20_w(void *info, UINT8 offset, UINT8 data)
{
	ga20_state *chip = (ga20_state *)info;
	struct IremGA20_channel_def* ch;
	int channel;

	//logerror("GA20:  Offset %02x, data %04x\n",offset,data);

	offset &= 0x1F;
	channel = offset >> 3;

	chip->regs[offset] = data;

	// channel regs:
	// 0,1: start address
	// 2,3: end? address
	// 4: rate
	// 5: volume
	// 6: control
	// 7: voice status (read-only)

	ch = &chip->channel[channel];
	switch (offset & 0x7)
	{
		case 0: /* start address low */
			ch->start = (ch->start&0xff000) | (data<<4);
			break;

		case 1: /* start address high */
			ch->start = (ch->start&0x00ff0) | (data<<12);
			break;

		case 2: /* end? address low */
			ch->end = (ch->end&0xff000) | (data<<4);
			break;

		case 3: /* end? address high */
			ch->end = (ch->end&0x00ff0) | (data<<12);
			break;

		case 4:
			ch->rate = data;
			ch->fracrate = (1 << RATE_SHIFT) / (0x100 - ch->rate);
			break;

		case 5: //AT: gain control
			ch->volume = (data * MAX_VOL) / (data + 10);
			break;

		case 6: //AT: this is always written 2(enabling both channels?)
			// d1: key on/off
			if (data & 2)
			{
				ch->play = 1;
				ch->pos = ch->start;
				ch->counter = ch->rate;
				ch->frac = 0;
				irem_ga20_cache_samples(chip, ch);
			}
			else
			{
				ch->play = 0;
			}

			// other: unknown/unused
			// possibilities are: loop flag, left/right speaker(stereo)
			break;
	}
}